

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lighting_database.cpp
# Opt level: O0

void LightingDb::prepare_light(GLuint p_shader_id)

{
  bool bVar1;
  reference ppVar2;
  vec3 vVar3;
  vec3 local_130;
  vec3 local_120;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  reference local_50;
  pair<const_unsigned_long,_PointLight> *point_light;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<unsigned_long,_PointLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PointLight>_>_>
  *__range1_1;
  pair<const_unsigned_long,_DirectionalLight> *dir_light;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_long,_DirectionalLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DirectionalLight>_>_>
  *__range1;
  GLuint p_shader_id_local;
  
  if (prepare_light::first) {
    prepare_light::first = false;
    create_dir_light();
    create_point_light(0x100,0x100);
  }
  __end1 = std::
           unordered_map<unsigned_long,_DirectionalLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DirectionalLight>_>_>
           ::begin((unordered_map<unsigned_long,_DirectionalLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DirectionalLight>_>_>
                    *)dir_map);
  dir_light = (pair<const_unsigned_long,_DirectionalLight> *)
              std::
              unordered_map<unsigned_long,_DirectionalLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DirectionalLight>_>_>
              ::end((unordered_map<unsigned_long,_DirectionalLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DirectionalLight>_>_>
                     *)dir_map);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_DirectionalLight>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_DirectionalLight>,_false>
                         *)&dir_light);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_DirectionalLight>,_false,_false>::
             operator*(&__end1);
    ShaderUtilities::attach_dir_light(p_shader_id,&ppVar2->second);
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_DirectionalLight>,_false,_false>::
    operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<unsigned_long,_PointLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PointLight>_>_>
             ::begin((unordered_map<unsigned_long,_PointLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PointLight>_>_>
                      *)point_map);
  point_light = (pair<const_unsigned_long,_PointLight> *)
                std::
                unordered_map<unsigned_long,_PointLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PointLight>_>_>
                ::end((unordered_map<unsigned_long,_PointLight,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PointLight>_>_>
                       *)point_map);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_PointLight>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_PointLight>,_false> *)
                        &point_light);
    if (!bVar1) break;
    local_50 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_PointLight>,_false,_false>::operator*
                         (&__end1_1);
    ShaderUtilities::attach_point_light(p_shader_id,&local_50->second);
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_PointLight>,_false,_false>::
    operator++(&__end1_1);
  }
  ShaderUtilities::add_spot_light(p_shader_id,(bool)(LightingDbWindow::enable_spot_light & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"far_plane",&local_71);
  ShaderUtilities::setFloat(p_shader_id,&local_70,LightingDbWindow::far_plane);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"shadow_bias",&local_99);
  ShaderUtilities::setFloat(p_shader_id,&local_98,LightingDbWindow::shadow_bias);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"enable_shadow",&local_c1);
  ShaderUtilities::setBool(p_shader_id,&local_c0,(bool)(LightingDbWindow::enable_shadow & 1));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"enable_shadow_debug",&local_e9);
  ShaderUtilities::setBool(p_shader_id,&local_e8,(bool)(LightingDbWindow::enable_shadow_debug & 1));
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"camera_position",&local_111);
  vVar3 = AkarinCameraSystem::get_position();
  local_130._0_8_ = vVar3._0_8_;
  local_120.field_0 = local_130.field_0;
  local_120.field_1 = local_130.field_1;
  local_130.field_2 = vVar3.field_2;
  local_120.field_2 = local_130.field_2;
  ShaderUtilities::setVec3(p_shader_id,&local_110,&local_120);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  return;
}

Assistant:

void LightingDb::prepare_light(
    const GLuint p_shader_id) noexcept
{
    static bool first = true;
    if (first)
    {
        first = false;
        create_dir_light();
        create_point_light(256, 256);
    }
    for (const auto &dir_light : dir_map)
    {
        ShaderUtilities::attach_dir_light(
            p_shader_id,
            dir_light.second);
    };
    for (const auto &point_light : point_map)
    {
        ShaderUtilities::attach_point_light(
            p_shader_id,
            point_light.second);
    }
    ShaderUtilities::add_spot_light(
        p_shader_id,
        LightingDbWindow::enable_spot_light);

    // TODO :: Move this to PointLight
    ShaderUtilities::setFloat(
        p_shader_id,
        "far_plane",
        LightingDbWindow::far_plane);
    ShaderUtilities::setFloat(
        p_shader_id,
        "shadow_bias",
        LightingDbWindow::shadow_bias);
    ShaderUtilities::setBool(
        p_shader_id,
        "enable_shadow",
        LightingDbWindow::enable_shadow);
    ShaderUtilities::setBool(
        p_shader_id,
        "enable_shadow_debug",
        LightingDbWindow::enable_shadow_debug);
    ShaderUtilities::setVec3(
        p_shader_id,
        "camera_position",
        AkarinCameraSystem::get_position());
}